

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::FormatString<char[20],char_const*,char[4],std::__cxx11::string,char[152]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [20],char **Args_1,
          char (*Args_2) [4],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_3,
          char (*Args_4) [152])

{
  stringstream local_1c0 [8];
  stringstream ss;
  char (*Args_local_4) [152];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_local_3;
  char (*Args_local_2) [4];
  char **Args_local_1;
  char (*Args_local) [20];
  
  std::__cxx11::stringstream::stringstream(local_1c0);
  FormatStrSS<std::__cxx11::stringstream,char[20],char_const*,char[4],std::__cxx11::string,char[152]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
             (char (*) [20])this,(char **)Args,(char (*) [4])Args_1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args_2,
             (char (*) [152])Args_3);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}